

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_tet(REF_SUBDIV ref_subdiv,REF_INT cell,REF_BOOL *again)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  REF_CELL ref_cell_00;
  REF_INT *pRVar6;
  REF_INT RVar7;
  uint uVar8;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sum;
  REF_CELL ref_cell;
  REF_BOOL *again_local;
  REF_INT cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell_00 = ref_subdiv->grid->cell[8];
  ref_subdiv_local._4_4_ = ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell_00,cell,again,3,4,5);
  if (ref_subdiv_local._4_4_ == 0) {
    ref_subdiv_local._4_4_ = ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell_00,cell,again,1,2,5);
    if (ref_subdiv_local._4_4_ == 0) {
      ref_subdiv_local._4_4_ = ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell_00,cell,again,0,4,2);
      if (ref_subdiv_local._4_4_ == 0) {
        ref_subdiv_local._4_4_ = ref_subdiv_unmark_tet_face(ref_subdiv,ref_cell_00,cell,again,0,1,3)
        ;
        if (ref_subdiv_local._4_4_ == 0) {
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,0,cell);
          iVar1 = pRVar6[RVar7];
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,1,cell);
          iVar2 = pRVar6[RVar7];
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,2,cell);
          iVar3 = pRVar6[RVar7];
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,3,cell);
          iVar4 = pRVar6[RVar7];
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,4,cell);
          iVar5 = pRVar6[RVar7];
          pRVar6 = ref_subdiv->mark;
          RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,5,cell);
          if (iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + pRVar6[RVar7] == 2) {
            uVar8 = ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell_00,cell,again,0,5);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x21c,"ref_subdiv_unmark_tet",(ulong)uVar8,"edges 0-5");
              return uVar8;
            }
            uVar8 = ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell_00,cell,again,1,4);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x21e,"ref_subdiv_unmark_tet",(ulong)uVar8,"edges 1-4");
              return uVar8;
            }
            uVar8 = ref_subdiv_unmark_tet_opp_edge(ref_subdiv,ref_cell_00,cell,again,2,3);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x220,"ref_subdiv_unmark_tet",(ulong)uVar8,"edges 2-3");
              return uVar8;
            }
          }
          ref_subdiv_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x20b,"ref_subdiv_unmark_tet",(ulong)ref_subdiv_local._4_4_,"face 3");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x209,"ref_subdiv_unmark_tet",(ulong)ref_subdiv_local._4_4_,"face 2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x207,"ref_subdiv_unmark_tet",(ulong)ref_subdiv_local._4_4_,"face 1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x205,
           "ref_subdiv_unmark_tet",(ulong)ref_subdiv_local._4_4_,"face 0");
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_tet(REF_SUBDIV ref_subdiv, REF_INT cell,
                                         REF_BOOL *again) {
  REF_CELL ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  REF_INT sum;

  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 3, 4, 5),
      "face 0");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 1, 2, 5),
      "face 1");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 0, 4, 2),
      "face 2");
  RSS(ref_subdiv_unmark_tet_face(ref_subdiv, ref_cell, cell, again, 0, 1, 3),
      "face 3");

  sum = ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 0, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 1, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 2, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 3, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 4, cell)) +
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, 5, cell));

  if (2 == sum) {
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 0, 5),
        "edges 0-5");
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 1, 4),
        "edges 1-4");
    RSS(ref_subdiv_unmark_tet_opp_edge(ref_subdiv, ref_cell, cell, again, 2, 3),
        "edges 2-3");
  }

  return REF_SUCCESS;
}